

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O0

void scan_bitstream_amiga(TrackData *trackdata)

{
  DataRate datarate_;
  uint uVar1;
  pointer pSVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint *pdw;
  size_type dwords;
  reference puVar6;
  uint32_t *pdw_00;
  LogHelper *pLVar7;
  int local_120;
  bool bad_data;
  undefined1 local_118 [8];
  Data data;
  undefined1 local_f0 [8];
  Sector sector;
  char *pcStack_a8;
  uint32_t disksum;
  uint *local_a0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_98;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90;
  undefined4 local_88;
  allocator<unsigned_int> local_81;
  undefined1 local_80 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> label;
  byte local_5f;
  byte local_5e;
  char local_5d;
  int max_sectors;
  uint8_t eot;
  uint8_t sector_nr;
  uint8_t track_nr;
  uint8_t type;
  uint32_t calcsum;
  uint32_t info;
  int sector_offset;
  uint32_t sync_mask;
  uint32_t dword;
  CRC16 crc;
  undefined1 local_38 [8];
  Track track;
  BitBuffer *bitbuf;
  TrackData *trackdata_local;
  
  track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)TrackData::bitstream(trackdata);
  BitBuffer::seek((BitBuffer *)
                  track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,0);
  Track::Track((Track *)local_38,0);
  local_38._0_4_ =
       BitBuffer::track_bitsize
                 ((BitBuffer *)
                  track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  CRC16::CRC16((CRC16 *)((long)&sync_mask + 2),0xffff);
  sector_offset = 0;
  info = 0xffffffff;
  if (opt.a1sync != 0) {
    info = 0xffdfffdf;
  }
  while ((bVar3 = BitBuffer::wrapped((BitBuffer *)
                                     track.m_sectors.
                                     super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage),
         ((bVar3 ^ 0xffU) & 1) != 0 &&
         ((iVar5 = Track::size((Track *)local_38), iVar5 != 0 ||
          (iVar5 = BitBuffer::tell((BitBuffer *)
                                   track.m_sectors.
                                   super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage),
          iVar5 <= (int)local_38._0_4_))))) {
    uVar1 = sector_offset * 2;
    bVar4 = BitBuffer::read1((BitBuffer *)
                             track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    sector_offset = uVar1 | bVar4;
    if ((sector_offset & info) == 0x44894489) {
      calcsum = BitBuffer::tell((BitBuffer *)
                                track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      _eot = 0;
      max_sectors = 0;
      bVar3 = amiga_read_dwords((BitBuffer *)
                                track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(uint32_t *)&eot,1
                                ,(uint32_t *)&max_sectors);
      if (bVar3) {
        local_5d = (char)_eot;
        local_5e = (byte)(_eot >> 8);
        local_5f = (byte)(_eot >> 0x10);
        bVar4 = (byte)(_eot >> 0x18);
        label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0xb;
        if (((track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)->header).cyl == 500000) {
          label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 0x16;
        }
        if ((((local_5d == -1) &&
             (local_5f <
              label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_)) && (bVar4 != 0)) &&
           ((bVar4 <= label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ &&
            ((uint)local_5e == ((trackdata->cylhead).cyl * 2 + (trackdata->cylhead).head & 0xffU))))
           ) {
          std::allocator<unsigned_int>::allocator(&local_81);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,4,&local_81);
          std::allocator<unsigned_int>::~allocator(&local_81);
          pSVar2 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          pdw = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
          dwords = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
          bVar3 = amiga_read_dwords((BitBuffer *)pSVar2,pdw,dwords,(uint32_t *)&max_sectors);
          if (bVar3) {
            local_98._M_current =
                 (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80)
            ;
            local_a0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                          local_80);
            local_90 = std::
                       max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                                 (local_98,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                            )local_a0);
            puVar6 = __gnu_cxx::
                     __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     ::operator*(&local_90);
            if (*puVar6 != 0) {
              pcStack_a8 = CHS((trackdata->cylhead).cyl,(trackdata->cylhead).head,_eot >> 8 & 0xff);
              Message<char_const*>
                        (msgWarning,"%s label field is not empty",&stack0xffffffffffffff58);
            }
            bVar3 = amiga_read_dwords((BitBuffer *)
                                      track.m_sectors.
                                      super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage,
                                      (uint32_t *)
                                      ((long)&sector.m_data.
                                              super__Vector_base<Data,_std::allocator<Data>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                                      ,1,(uint32_t *)&max_sectors);
            if (bVar3) {
              max_sectors = max_sectors & 0x55555555;
              if ((max_sectors == 0) || (opt.idcrc != 0)) {
                datarate_ = ((track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)->header).cyl;
                Header::Header((Header *)
                               &data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               &trackdata->cylhead,(uint)local_5f,2);
                Sector::Sector((Sector *)local_f0,datarate_,Amiga,
                               (Header *)
                               &data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,0);
                sector.datarate =
                     BitBuffer::track_offset
                               ((BitBuffer *)
                                track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,calcsum);
                bVar3 = amiga_read_dwords((BitBuffer *)
                                          track.m_sectors.
                                          super__Vector_base<Sector,_std::allocator<Sector>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                                          (uint32_t *)
                                          ((long)&sector.m_data.
                                                  super__Vector_base<Data,_std::allocator<Data>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4),1,(uint32_t *)&max_sectors);
                if (bVar3) {
                  iVar5 = Sector::size((Sector *)local_f0);
                  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)&bad_data);
                  Data::vector((Data *)local_118,(long)iVar5,(allocator<unsigned_char> *)&bad_data);
                  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)&bad_data);
                  pSVar2 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
                  pdw_00 = (uint32_t *)
                           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_118);
                  iVar5 = Data::size((Data *)local_118);
                  bVar3 = amiga_read_dwords((BitBuffer *)pSVar2,pdw_00,(ulong)(long)iVar5 >> 2,
                                            (uint32_t *)&max_sectors);
                  if (bVar3) {
                    if (opt.debug != 0) {
                      pLVar7 = util::operator<<((LogHelper *)&util::cout,
                                                (char (*) [15])"s_b_amiga (id=");
                      pLVar7 = util::operator<<(pLVar7,&local_5f);
                      pLVar7 = util::operator<<(pLVar7,(char (*) [13])") at offset ");
                      pLVar7 = util::operator<<(pLVar7,(int *)&calcsum);
                      pLVar7 = util::operator<<(pLVar7,(char (*) [3])0x2a84f9);
                      local_120 = BitBuffer::track_offset
                                            ((BitBuffer *)
                                             track.m_sectors.
                                             super__Vector_base<Sector,_std::allocator<Sector>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                                             calcsum);
                      pLVar7 = util::operator<<(pLVar7,&local_120);
                      util::operator<<(pLVar7,(char (*) [3])0x2a981c);
                    }
                    Sector::add((Sector *)local_f0,(Data *)local_118,
                                (max_sectors & 0x55555555U) != 0,'\0');
                    Track::add((Track *)local_38,(Sector *)local_f0);
                    local_88 = 0;
                  }
                  else {
                    local_88 = 2;
                  }
                  Data::~Data((Data *)local_118);
                }
                else {
                  local_88 = 2;
                }
                Sector::~Sector((Sector *)local_f0);
              }
              else {
                local_88 = 2;
              }
            }
            else {
              local_88 = 2;
            }
          }
          else {
            local_88 = 2;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
        }
      }
    }
  }
  TrackData::add(trackdata,(Track *)local_38);
  Track::~Track((Track *)local_38);
  return;
}

Assistant:

void scan_bitstream_amiga(TrackData& trackdata)
{
    auto& bitbuf = trackdata.bitstream();
    bitbuf.seek(0);

    Track track;
    track.tracklen = bitbuf.track_bitsize();

    CRC16 crc;
    uint32_t dword = 0;
    uint32_t sync_mask = opt.a1sync ? 0xffdfffdf : 0xffffffff;

    while (!bitbuf.wrapped())
    {
        // Give up if no headers were found in the first revolution
        if (!track.size() && bitbuf.tell() > track.tracklen)
            break;

        dword = (dword << 1) | bitbuf.read1();

        // Check for A1A1 MFM sync markers
        if ((dword & sync_mask) != 0x44894489)
            continue;

        auto sector_offset = bitbuf.tell();

        // Decode the info block from the odd and even MFM components
        uint32_t info = 0, calcsum = 0;
        if (!amiga_read_dwords(bitbuf, &info, 1, calcsum))
            continue;

        uint8_t type = info & 0xff;
        uint8_t track_nr = (info >> 8) & 0xff;
        uint8_t sector_nr = (info >> 16) & 0xff;
        uint8_t eot = (info >> 24) & 0xff;

        // Check for AmigaDOS (0xff), sector / sector end within normal range, and track number matching physical location
        auto max_sectors{ (bitbuf.datarate == DataRate::_500K) ? 22 : 11 };
        if (type != 0xff || sector_nr >= max_sectors || !eot || eot > max_sectors ||
            track_nr != static_cast<uint8_t>((trackdata.cylhead.cyl << 1) + trackdata.cylhead.head))
            continue;

        std::vector<uint32_t> label(4);
        if (!amiga_read_dwords(bitbuf, label.data(), label.size(), calcsum))
            continue;

        // Warn if the label field isn't empty
        if (*std::max_element(label.begin(), label.end()) != 0)
            Message(msgWarning, "%s label field is not empty", CHS(trackdata.cylhead.cyl, trackdata.cylhead.head, (info >> 8) & 0xff));

        // Read the header checksum, and combine with checksum so far
        uint32_t disksum;
        if (!amiga_read_dwords(bitbuf, &disksum, 1, calcsum))
            continue;

        // Mask the checksum to include only the data bits
        calcsum &= MFM_MASK;
        if (calcsum != 0 && !opt.idcrc)
            continue;

        Sector sector(bitbuf.datarate, Encoding::Amiga, Header(trackdata.cylhead, sector_nr, 2));
        sector.offset = bitbuf.track_offset(sector_offset);

        // Read the data checksum
        if (!amiga_read_dwords(bitbuf, &disksum, 1, calcsum))
            continue;

        // Read the data field
        Data data(sector.size());
        if (!amiga_read_dwords(bitbuf, reinterpret_cast<uint32_t*>(data.data()), data.size() / sizeof(uint32_t), calcsum))
            continue;

        if (opt.debug)
            util::cout << "s_b_amiga (id=" << sector_nr << ") at offset " << sector_offset << " (" << bitbuf.track_offset(sector_offset) << ")\n";

        bool bad_data = (calcsum & MFM_MASK) != 0;
        sector.add(std::move(data), bad_data, 0x00);

        track.add(std::move(sector));
    }

    trackdata.add(std::move(track));
}